

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsDiurnal_FSA_kry.c
# Opt level: O3

int f(sunrealtype t,N_Vector y,N_Vector ydot,void *user_data)

{
  long lVar1;
  long lVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double *pdVar17;
  double dVar18;
  double dVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  uint uVar24;
  long lVar25;
  long lVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  long lVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double local_c0;
  
  lVar20 = N_VGetArrayPointer();
  lVar21 = N_VGetArrayPointer();
  pdVar17 = *user_data;
  dVar3 = *pdVar17;
  dVar4 = pdVar17[1];
  dVar5 = pdVar17[2];
  dVar6 = pdVar17[3];
  dVar7 = pdVar17[4];
  dVar18 = sin(t * *(double *)((long)user_data + 0x1528));
  dVar31 = 0.0;
  local_c0 = 0.0;
  if (0.0 < dVar18) {
    dVar31 = exp(-dVar6 / dVar18);
    local_c0 = exp(-dVar7 / dVar18);
  }
  *(double *)((long)user_data + 0x1520) = local_c0;
  dVar6 = *(double *)((long)user_data + 0x1538);
  dVar7 = *(double *)((long)user_data + 0x1540);
  dVar18 = *(double *)((long)user_data + 0x1550);
  dVar8 = *(double *)((long)user_data + 0x1548);
  dVar31 = dVar31 * dVar5;
  lVar1 = lVar20 + 8;
  lVar21 = lVar21 + 8;
  lVar25 = 0;
  lVar30 = lVar1;
  do {
    dVar19 = ((double)(int)lVar25 + -0.5) * dVar6 + 30.0;
    dVar34 = exp(dVar19 * 0.2);
    dVar19 = exp((dVar6 + dVar19) * 0.2);
    dVar19 = dVar19 * dVar18;
    lVar22 = 0xffffffff;
    lVar23 = 1;
    if (lVar25 == 0) {
      lVar22 = 1;
    }
    if (lVar25 == 0xe) {
      lVar23 = 0xffffffff;
    }
    dVar34 = dVar34 * -dVar18;
    lVar2 = lVar20 + lVar25 * 0xf0;
    uVar24 = (int)lVar25 * 0x1e | 1;
    lVar23 = ((lVar23 + lVar25) * 0x1e00000000 >> 0x1d) + lVar1;
    lVar22 = ((lVar22 + lVar25) * 0x1e00000000 >> 0x1d) + lVar1;
    lVar26 = 0;
    iVar27 = 0;
    do {
      dVar9 = *(double *)(lVar30 + -8 + lVar26);
      dVar10 = *(double *)(lVar30 + lVar26);
      dVar32 = dVar3 * dVar9 * dVar5;
      dVar33 = dVar4 * dVar9 * dVar10;
      dVar11 = *(double *)(lVar23 + lVar26);
      dVar12 = *(double *)(lVar22 + lVar26);
      iVar29 = iVar27 + (uint)(lVar26 != 0xe0) * 2;
      iVar28 = (-(uint)(lVar26 != 0) | 1) + iVar27;
      dVar13 = *(double *)(lVar2 + (long)(iVar28 * 2) * 8);
      dVar14 = *(double *)(lVar2 + (long)(iVar29 * 2 + -2) * 8);
      dVar15 = *(double *)(lVar20 + (long)(int)((uVar24 - 2) + iVar29 * 2) * 8);
      dVar16 = *(double *)(lVar20 + (long)(int)(uVar24 + iVar28 * 2) * 8);
      *(double *)(lVar21 + -8 + lVar26) =
           (dVar14 - dVar13) * dVar8 +
           ((dVar14 - (dVar9 + dVar9)) + dVar13) * dVar7 +
           (*(double *)(lVar23 + -8 + lVar26) - dVar9) * dVar19 +
           (dVar9 - *(double *)(lVar22 + -8 + lVar26)) * dVar34 +
           (-dVar32 - dVar33) + dVar31 + dVar31 + local_c0 * dVar10;
      *(double *)(lVar21 + lVar26) =
           (dVar15 - dVar16) * dVar8 +
           ((dVar15 - (dVar10 + dVar10)) + dVar16) * dVar7 +
           (dVar11 - dVar10) * dVar19 + (dVar10 - dVar12) * dVar34 +
           ((dVar32 - dVar33) - local_c0 * dVar10);
      iVar27 = iVar27 + 1;
      lVar26 = lVar26 + 0x10;
    } while (lVar26 != 0xf0);
    lVar25 = lVar25 + 1;
    lVar21 = lVar21 + 0xf0;
    lVar30 = lVar30 + 0xf0;
  } while (lVar25 != 0xf);
  return 0;
}

Assistant:

static int f(sunrealtype t, N_Vector y, N_Vector ydot, void* user_data)
{
  sunrealtype q3, c1, c2, c1dn, c2dn, c1up, c2up, c1lt, c2lt;
  sunrealtype c1rt, c2rt, czdn, czup, hord1, hord2, horad1, horad2;
  sunrealtype qq1, qq2, qq3, qq4, rkin1, rkin2, s, vertd1, vertd2, zdn, zup;
  sunrealtype q4coef, delz, verdco, hordco, horaco;
  sunrealtype *ydata, *dydata;
  int jx, jz, idn, iup, ileft, iright;
  UserData data;
  sunrealtype Q1, Q2, C3, A3, A4;

  data   = (UserData)user_data;
  ydata  = N_VGetArrayPointer(y);
  dydata = N_VGetArrayPointer(ydot);

  /* Load problem coefficients and parameters */

  Q1 = data->p[0];
  Q2 = data->p[1];
  C3 = data->p[2];
  A3 = data->p[3];
  A4 = data->p[4];

  /* Set diurnal rate coefficients. */

  s = sin(data->om * t);
  if (s > ZERO)
  {
    q3       = exp(-A3 / s);
    data->q4 = exp(-A4 / s);
  }
  else
  {
    q3       = ZERO;
    data->q4 = ZERO;
  }

  /* Make local copies of problem variables, for efficiency. */

  q4coef = data->q4;
  delz   = data->dz;
  verdco = data->vdco;
  hordco = data->hdco;
  horaco = data->haco;

  /* Loop over all grid points. */

  for (jz = 0; jz < MZ; jz++)
  {
    /* Set vertical diffusion coefficients at jz +- 1/2 */

    zdn  = ZMIN + (jz - SUN_RCONST(0.5)) * delz;
    zup  = zdn + delz;
    czdn = verdco * exp(SUN_RCONST(0.2) * zdn);
    czup = verdco * exp(SUN_RCONST(0.2) * zup);
    idn  = (jz == 0) ? 1 : -1;
    iup  = (jz == MZ - 1) ? -1 : 1;
    for (jx = 0; jx < MX; jx++)
    {
      /* Extract c1 and c2, and set kinetic rate terms. */

      c1    = IJKth(ydata, 1, jx, jz);
      c2    = IJKth(ydata, 2, jx, jz);
      qq1   = Q1 * c1 * C3;
      qq2   = Q2 * c1 * c2;
      qq3   = q3 * C3;
      qq4   = q4coef * c2;
      rkin1 = -qq1 - qq2 + SUN_RCONST(2.0) * qq3 + qq4;
      rkin2 = qq1 - qq2 - qq4;

      /* Set vertical diffusion terms. */

      c1dn   = IJKth(ydata, 1, jx, jz + idn);
      c2dn   = IJKth(ydata, 2, jx, jz + idn);
      c1up   = IJKth(ydata, 1, jx, jz + iup);
      c2up   = IJKth(ydata, 2, jx, jz + iup);
      vertd1 = czup * (c1up - c1) - czdn * (c1 - c1dn);
      vertd2 = czup * (c2up - c2) - czdn * (c2 - c2dn);

      /* Set horizontal diffusion and advection terms. */

      ileft  = (jx == 0) ? 1 : -1;
      iright = (jx == MX - 1) ? -1 : 1;
      c1lt   = IJKth(ydata, 1, jx + ileft, jz);
      c2lt   = IJKth(ydata, 2, jx + ileft, jz);
      c1rt   = IJKth(ydata, 1, jx + iright, jz);
      c2rt   = IJKth(ydata, 2, jx + iright, jz);
      hord1  = hordco * (c1rt - SUN_RCONST(2.0) * c1 + c1lt);
      hord2  = hordco * (c2rt - SUN_RCONST(2.0) * c2 + c2lt);
      horad1 = horaco * (c1rt - c1lt);
      horad2 = horaco * (c2rt - c2lt);

      /* Load all terms into ydot. */

      IJKth(dydata, 1, jx, jz) = vertd1 + hord1 + horad1 + rkin1;
      IJKth(dydata, 2, jx, jz) = vertd2 + hord2 + horad2 + rkin2;
    }
  }

  return (0);
}